

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

string * __thiscall
libcellml::convertToString_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,double value,bool fullPrecision)

{
  ostringstream strs;
  long local_188;
  undefined8 local_180 [13];
  ios_base local_118 [264];
  
  if (NAN(value)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nan","");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    if ((char)this != '\0') {
      *(undefined8 *)((long)local_180 + *(long *)(local_188 + -0x18)) = 0xf;
    }
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
    std::ios_base::~ios_base(local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string convertToString(double value, bool fullPrecision)
{
    if (std::isnan(value)) {
        // Always return "nan" whether we are dealing with +NAN or -NAN. This is to ensure that
        // the string representation of a NAN is consistent across compilers.
        return "nan";
    }
    std::ostringstream strs;
    if (fullPrecision) {
        strs << std::setprecision(std::numeric_limits<double>::digits10) << value;
    } else {
        strs << value;
    }
    return strs.str();
}